

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O2

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Return *return_stmt)

{
  element_type *peVar1;
  ostream *poVar2;
  int iVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar3 = this->spaces_ + 2;
  this->spaces_ = iVar3;
  poVar2 = this->out_;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)iVar3);
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  std::operator<<(poVar2,"<return>\n");
  std::__cxx11::string::~string((string *)local_40);
  peVar1 = (return_stmt->expr_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_Expr[1])(peVar1,this);
  poVar2 = this->out_;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)this->spaces_);
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  std::operator<<(poVar2,"</return>\n");
  std::__cxx11::string::~string((string *)local_40);
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Return& return_stmt) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<return>\n";
  return_stmt.expr_->Accept(*this);
  out_ << std::string(spaces_, ' ') << "</return>\n";
  spaces_ -= TAB_SIZE;
  return 0;
}